

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O1

int supdup_exitcode(Backend *be)

{
  int iVar1;
  
  if (be[-10].interactor != (Interactor *)0x0) {
    return -1;
  }
  iVar1 = 0x7fffffff;
  if (*(char *)((long)&be[-9].vt + 1) == '\0') {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int supdup_exitcode(Backend *be)
{
    Supdup *supdup = container_of(be, Supdup, backend);
    if (supdup->s != NULL)
        return -1;                     /* still connected */
    else if (supdup->closed_on_socket_error)
        return INT_MAX;     /* a socket error counts as an unclean exit */
    else
        /* Supdup doesn't transmit exit codes back to the client */
        return 0;
}